

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

container_t *
container_inot_range
          (container_t *c,uint8_t type,uint32_t range_start,uint32_t range_end,uint8_t *result_type)

{
  undefined1 uVar1;
  _Bool _Var2;
  int iVar3;
  undefined4 in_ECX;
  char in_SIL;
  bitset_container_t *in_R8;
  int unaff_retaddr;
  int unaff_retaddr_00;
  container_t *result;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  container_t *pcVar4;
  undefined4 in_stack_ffffffffffffffe0;
  container_t **in_stack_fffffffffffffff8;
  
  get_writable_copy_if_shared
            ((container_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             (uint8_t *)0x165fcc);
  pcVar4 = (container_t *)0x0;
  if (in_SIL == '\x01') {
    _Var2 = bitset_container_negation_range_inplace
                      (in_R8,0,0,(container_t **)(ulong)CONCAT14(1,in_stack_ffffffffffffffc8));
    uVar1 = 2;
    if (_Var2) {
      uVar1 = 1;
    }
    *(undefined1 *)&in_R8->cardinality = uVar1;
  }
  else if (in_SIL == '\x02') {
    _Var2 = array_container_negation_range_inplace
                      ((array_container_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                       (int)((ulong)in_R8 >> 0x20),(int)in_R8,(container_t **)0x0);
    uVar1 = 2;
    if (_Var2) {
      uVar1 = 1;
    }
    *(undefined1 *)&in_R8->cardinality = uVar1;
  }
  else {
    iVar3 = run_container_negation_range_inplace
                      ((run_container_t *)result,unaff_retaddr_00,unaff_retaddr,
                       in_stack_fffffffffffffff8);
    *(char *)&in_R8->cardinality = (char)iVar3;
  }
  return pcVar4;
}

Assistant:

static inline container_t *container_inot_range(container_t *c, uint8_t type,
                                                uint32_t range_start,
                                                uint32_t range_end,
                                                uint8_t *result_type) {
    c = get_writable_copy_if_shared(c, &type);
    container_t *result = NULL;
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            *result_type = bitset_container_negation_range_inplace(
                               CAST_bitset(c), range_start, range_end, &result)
                               ? BITSET_CONTAINER_TYPE
                               : ARRAY_CONTAINER_TYPE;
            return result;
        case ARRAY_CONTAINER_TYPE:
            *result_type = array_container_negation_range_inplace(
                               CAST_array(c), range_start, range_end, &result)
                               ? BITSET_CONTAINER_TYPE
                               : ARRAY_CONTAINER_TYPE;
            return result;
        case RUN_CONTAINER_TYPE:
            *result_type = (uint8_t)run_container_negation_range_inplace(
                CAST_run(c), range_start, range_end, &result);
            return result;

        default:
            assert(false);
            roaring_unreachable;
    }
    assert(false);
    roaring_unreachable;
    return NULL;
}